

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

Element * Assimp::FBX::GetRequiredElement(Scope *sc,string *index,Element *element)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Element *local_28;
  Element *el;
  Element *element_local;
  string *index_local;
  Scope *sc_local;
  
  el = element;
  element_local = (Element *)index;
  index_local = (string *)sc;
  local_28 = Scope::operator[](sc,index);
  if (local_28 == (Element *)0x0) {
    std::operator+(&local_68,"did not find required element \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   element_local);
    std::operator+(&local_48,&local_68,"\"");
    anon_unknown.dwarf_d3af7e::ParseError(&local_48,el);
  }
  return local_28;
}

Assistant:

const Element& GetRequiredElement(const Scope& sc, const std::string& index, const Element* element /*= NULL*/)
{
    const Element* el = sc[index];
    if(!el) {
        ParseError("did not find required element \"" + index + "\"",element);
    }
    return *el;
}